

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

int Sbc_ManWlcNodes(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGia2Out,int nOuts)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Wlc_Obj_t *pWVar5;
  bool bVar6;
  int iVar7;
  uint *__ptr;
  void *pvVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar8 = malloc(400);
  *(void **)(__ptr + 2) = pvVar8;
  if (1 < pNtk->iObj) {
    uVar12 = 1;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar12) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((long)(pNtk->vCopies).nSize <= (long)uVar12) {
LAB_00335db9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pWVar5 = pNtk->pObjs;
      iVar7 = pWVar5[uVar12].End - pWVar5[uVar12].Beg;
      iVar10 = -iVar7;
      if (0 < iVar7) {
        iVar10 = iVar7;
      }
      uVar2 = (pNtk->vCopies).pArray[uVar12];
      __ptr[1] = 0;
      uVar11 = 0;
      do {
        if (((int)uVar2 < 0) || (lVar1 = uVar2 + uVar11, (pNtk->vBits).nSize <= (int)lVar1))
        goto LAB_00335db9;
        uVar3 = (pNtk->vBits).pArray[lVar1];
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (vGia2Out->nSize <= (int)(uVar3 >> 1)) goto LAB_00335db9;
        uVar4 = vGia2Out->pArray[uVar3 >> 1];
        if (uVar4 != 0xffffffff) {
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pcVar9 = Wlc_ObjName(pNtk,(int)((long)pWVar5 + (uVar12 * 0x18 - (long)pNtk->pObjs) >> 3) *
                                    -0x55555555);
          uVar13 = uVar4 >> 1;
          printf("Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n",uVar12,pcVar9
                 ,uVar11 & 0xffffffff,(ulong)(iVar10 + 1),(ulong)uVar13,(uVar3 ^ uVar4) & 1);
          uVar3 = *__ptr;
          uVar4 = __ptr[1];
          uVar14 = (ulong)uVar4;
          if (uVar4 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar8 = malloc(0x40);
              }
              else {
                pvVar8 = realloc(*(void **)(__ptr + 2),0x40);
              }
              *(void **)(__ptr + 2) = pvVar8;
              uVar15 = 0x10;
            }
            else {
              uVar15 = uVar3 * 2;
              if ((int)uVar15 <= (int)uVar3) goto LAB_00335cdd;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar8 = malloc((ulong)uVar3 << 3);
              }
              else {
                pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 3);
              }
              *(void **)(__ptr + 2) = pvVar8;
            }
            if (pvVar8 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *__ptr = uVar15;
          }
LAB_00335cdd:
          __ptr[1] = uVar4 + 1;
          if (0 < (int)uVar4) {
            lVar1 = *(long *)(__ptr + 2);
            do {
              iVar7 = *(int *)(lVar1 + -4 + uVar14 * 4);
              if (iVar7 <= (int)uVar13) goto LAB_00335d21;
              *(int *)(lVar1 + uVar14 * 4) = iVar7;
              bVar6 = 1 < (long)uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar6);
            uVar14 = 0;
          }
LAB_00335d21:
          *(uint *)(*(long *)(__ptr + 2) + (long)(int)uVar14 * 4) = uVar13;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != iVar10 + 1);
      uVar2 = __ptr[1];
      if (0 < (int)uVar2) {
        putchar(10);
      }
      if (uVar2 == nOuts) {
        printf("Found object %d with all bits matched.\n",uVar12 & 0xffffffff);
        iVar10 = (int)uVar12;
        goto LAB_00335d8a;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)pNtk->iObj);
  }
  iVar10 = -1;
LAB_00335d8a:
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return iVar10;
}

Assistant:

int Sbc_ManWlcNodes( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGia2Out, int nOuts )
{
    Wlc_Obj_t * pObj;  
    int i, k, iLitGia, iLitOut, iFirst, nBits, iObjFound = -1;
    Vec_Int_t * vMatched = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        Vec_IntClear( vMatched );
        for ( k = 0; k < nBits; k++ )
        {
            iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            iLitOut = Vec_IntEntry( vGia2Out, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n", 
                i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits, Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut) );
            Vec_IntPushOrder( vMatched, Abc_Lit2Var(iLitOut) );
        }
        if ( Vec_IntSize(vMatched) > 0 )
            printf( "\n" );
        if ( Vec_IntSize(vMatched) == nOuts )
        {
            if ( iObjFound == -1 )
                iObjFound = i;
            printf( "Found object %d with all bits matched.\n", i );
            /*
            for ( k = nBits-2; k < nBits; k++ )
            {
                iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
                {
                    word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
                    Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
                }
            }
            */
            break;
        }
    }
    Vec_IntFree( vMatched );
    return iObjFound;
}